

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

_Bool mpack_reader_ensure_straddle(mpack_reader_t *reader,size_t count)

{
  char *pcVar1;
  mpack_reader_error_t p_Var2;
  size_t sVar3;
  mpack_error_t mVar4;
  size_t __n;
  bool bVar5;
  
  pcVar1 = reader->data;
  if (reader->fill == (mpack_reader_fill_t)0x0) {
    reader->error = mpack_error_invalid;
    reader->end = pcVar1;
    p_Var2 = reader->error_fn;
    if (p_Var2 == (mpack_reader_error_t)0x0) {
      return false;
    }
    mVar4 = mpack_error_invalid;
  }
  else {
    if (count <= reader->size) {
      __n = (long)reader->end - (long)pcVar1;
      memmove(reader->buffer,pcVar1,__n);
      pcVar1 = reader->buffer;
      reader->end = reader->end + ((long)pcVar1 - (long)reader->data);
      reader->data = pcVar1;
      sVar3 = mpack_fill_range(reader,pcVar1 + __n,count - __n,reader->size - __n);
      bVar5 = reader->error == mpack_ok;
      if (bVar5) {
        reader->end = reader->end + sVar3;
        return true;
      }
      return bVar5;
    }
    reader->error = mpack_error_too_big;
    reader->end = pcVar1;
    p_Var2 = reader->error_fn;
    if (p_Var2 == (mpack_reader_error_t)0x0) {
      return false;
    }
    mVar4 = mpack_error_too_big;
  }
  (*p_Var2)(reader,mVar4);
  return false;
}

Assistant:

MPACK_NOINLINE bool mpack_reader_ensure_straddle(mpack_reader_t* reader, size_t count) {
    mpack_assert(count != 0, "cannot ensure zero bytes!");
    mpack_assert(reader->error == mpack_ok, "reader cannot be in an error state!");

    mpack_assert(count > (size_t)(reader->end - reader->data),
            "straddling ensure requested for %i bytes, but there are %i bytes "
            "left in buffer. call mpack_reader_ensure() instead",
            (int)count, (int)(reader->end - reader->data));

    // we'll need a fill function to get more data. if there's no
    // fill function, the buffer should contain an entire MessagePack
    // object, so we raise mpack_error_invalid instead of mpack_error_io
    // on truncated data.
    if (reader->fill == NULL) {
        mpack_reader_flag_error(reader, mpack_error_invalid);
        return false;
    }

    // we need enough space in the buffer. if the buffer is not
    // big enough, we return mpack_error_too_big (since this is
    // for an in-place read larger than the buffer size.)
    if (count > reader->size) {
        mpack_reader_flag_error(reader, mpack_error_too_big);
        return false;
    }

    // move the existing data to the start of the buffer
    size_t left = (size_t)(reader->end - reader->data);
    mpack_memmove(reader->buffer, reader->data, left);
    reader->end -= reader->data - reader->buffer;
    reader->data = reader->buffer;

    // read at least the necessary number of bytes, accepting up to the
    // buffer size
    size_t read = mpack_fill_range(reader, reader->buffer + left,
            count - left, reader->size - left);
    if (mpack_reader_error(reader) != mpack_ok)
        return false;
    reader->end += read;
    return true;
}